

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerFacts.cpp
# Opt level: O1

string_view slang::parsing::LexerFacts::getDirectiveText(SyntaxKind kind)

{
  string_view sVar1;
  string_view sVar2;
  string_view sVar3;
  string_view sVar4;
  string_view sVar5;
  string_view sVar6;
  string_view sVar7;
  string_view sVar8;
  string_view sVar9;
  string_view sVar10;
  string_view sVar11;
  string_view sVar12;
  string_view sVar13;
  string_view sVar14;
  string_view sVar15;
  string_view sVar16;
  string_view sVar17;
  string_view sVar18;
  string_view sVar19;
  string_view sVar20;
  
  if ((int)kind < 0xe9) {
    if ((int)kind < 0xaa) {
      if ((int)kind < 0x83) {
        if (kind == BeginKeywordsDirective) {
          sVar17._M_str = "`begin_keywords";
          sVar17._M_len = 0xf;
          return sVar17;
        }
        if (kind == CellDefineDirective) {
          sVar5._M_str = "`celldefine";
          sVar5._M_len = 0xb;
          return sVar5;
        }
      }
      else {
        if (kind == DefaultNetTypeDirective) {
          sVar13._M_str = "`default_nettype";
          sVar13._M_len = 0x10;
          return sVar13;
        }
        if (kind == DefineDirective) {
          sVar9._M_str = "`define";
          sVar9._M_len = 7;
          return sVar9;
        }
        if (kind == ElsIfDirective) {
          sVar1._M_str = "`elsif";
          sVar1._M_len = 6;
          return sVar1;
        }
      }
    }
    else if ((int)kind < 0xb5) {
      if (kind == ElseDirective) {
        sVar19._M_str = "`else";
        sVar19._M_len = 5;
        return sVar19;
      }
      if (kind == EndCellDefineDirective) {
        sVar7._M_str = "`endcelldefine";
        sVar7._M_len = 0xe;
        return sVar7;
      }
    }
    else {
      if (kind == EndIfDirective) {
        sVar15._M_str = "`endif";
        sVar15._M_len = 6;
        return sVar15;
      }
      if (kind == EndKeywordsDirective) {
        sVar11._M_str = "`end_keywords";
        sVar11._M_len = 0xd;
        return sVar11;
      }
      if (kind == IfDefDirective) {
        sVar3._M_str = "`ifdef";
        sVar3._M_len = 6;
        return sVar3;
      }
    }
  }
  else if ((int)kind < 0x193) {
    if ((int)kind < 0x111) {
      if (kind == IfNDefDirective) {
        sVar18._M_str = "`ifndef";
        sVar18._M_len = 7;
        return sVar18;
      }
      if (kind == IncludeDirective) {
        sVar6._M_str = "`include";
        sVar6._M_len = 8;
        return sVar6;
      }
    }
    else {
      if (kind == LineDirective) {
        sVar14._M_str = "`line";
        sVar14._M_len = 5;
        return sVar14;
      }
      if (kind == NoUnconnectedDriveDirective) {
        sVar10._M_str = "`nounconnected_drive";
        sVar10._M_len = 0x14;
        return sVar10;
      }
      if (kind == PragmaDirective) {
        sVar2._M_str = "`pragma";
        sVar2._M_len = 7;
        return sVar2;
      }
    }
  }
  else if ((int)kind < 0x1f7) {
    if (kind == ResetAllDirective) {
      sVar20._M_str = "`resetall";
      sVar20._M_len = 9;
      return sVar20;
    }
    if (kind == TimeScaleDirective) {
      sVar8._M_str = "`timescale";
      sVar8._M_len = 10;
      return sVar8;
    }
  }
  else {
    if (kind == UnconnectedDriveDirective) {
      sVar16._M_str = "`unconnected_drive";
      sVar16._M_len = 0x12;
      return sVar16;
    }
    if (kind == UndefDirective) {
      sVar12._M_str = "`undef";
      sVar12._M_len = 6;
      return sVar12;
    }
    if (kind == UndefineAllDirective) {
      sVar4._M_str = "`undefineall";
      sVar4._M_len = 0xc;
      return sVar4;
    }
  }
  return (string_view)(ZEXT816(0x4ffe75) << 0x40);
}

Assistant:

std::string_view LexerFacts::getDirectiveText(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BeginKeywordsDirective: return "`begin_keywords";
        case SyntaxKind::CellDefineDirective: return "`celldefine";
        case SyntaxKind::DefaultNetTypeDirective: return "`default_nettype";
        case SyntaxKind::DefineDirective: return "`define";
        case SyntaxKind::ElseDirective: return "`else";
        case SyntaxKind::ElsIfDirective: return "`elsif";
        case SyntaxKind::EndKeywordsDirective: return "`end_keywords";
        case SyntaxKind::EndCellDefineDirective: return "`endcelldefine";
        case SyntaxKind::EndIfDirective: return "`endif";
        case SyntaxKind::IfDefDirective: return "`ifdef";
        case SyntaxKind::IfNDefDirective: return "`ifndef";
        case SyntaxKind::IncludeDirective: return "`include";
        case SyntaxKind::LineDirective: return "`line";
        case SyntaxKind::NoUnconnectedDriveDirective: return "`nounconnected_drive";
        case SyntaxKind::PragmaDirective: return "`pragma";
        case SyntaxKind::ResetAllDirective: return "`resetall";
        case SyntaxKind::TimeScaleDirective: return "`timescale";
        case SyntaxKind::UnconnectedDriveDirective: return "`unconnected_drive";
        case SyntaxKind::UndefDirective: return "`undef";
        case SyntaxKind::UndefineAllDirective: return "`undefineall";
        default: return "";
    }
}